

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library_bind.c
# Opt level: O3

int mpt_library_bind(mpt_libsymbol *sym,char *conf,char *path,mpt_logger *out)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  undefined1 uVar4;
  undefined7 uVar5;
  int iVar6;
  char *pcVar7;
  mpt_libsymbol next;
  mpt_libsymbol local_48;
  
  uVar4 = SUB81(out,0);
  uVar5 = (undefined7)((ulong)out >> 8);
  local_48.lib = (mpt_libhandle *)0x0;
  local_48.addr = (void *)0x0;
  local_48.type = 0;
  if (conf == (char *)0x0) {
    iVar6 = -1;
    if (out == (mpt_logger *)0x0) {
      return -1;
    }
    pcVar2 = "missing initializer target";
    pcVar7 = (char *)0x0;
LAB_0010139f:
    msg(out,pcVar7,3,(char *)CONCAT71(uVar5,uVar4),pcVar2);
  }
  else {
    pcVar2 = strchr(conf,0x40);
    if (pcVar2 == (char *)0x0) {
      iVar6 = 0;
    }
    else {
      pcVar7 = path;
      local_48.lib = mpt_library_open(pcVar2 + 1,path);
      iVar6 = 1;
      if (local_48.lib == (mpt_libhandle *)0x0) {
        if ((out != (mpt_logger *)0x0) && (lVar3 = dlerror(), lVar3 != 0)) {
          msg(out,pcVar7,(path == (char *)0x0) + 3,(char *)CONCAT71(uVar5,uVar4),lVar3);
        }
        iVar6 = -2;
        if (path == (char *)0x0) {
          return -2;
        }
        pcVar7 = (char *)0x0;
        local_48.lib = mpt_library_open(pcVar2 + 1,(char *)0x0);
        uVar4 = local_48.lib != (mpt_libhandle *)0x0 || out == (mpt_logger *)0x0;
        if (local_48.lib == (mpt_libhandle *)0x0 && out != (mpt_logger *)0x0) {
          pcVar2 = (char *)dlerror();
          if (pcVar2 == (char *)0x0) {
            return -2;
          }
          goto LAB_0010139f;
        }
        iVar6 = 2;
        if (local_48.lib == (mpt_libhandle *)0x0) {
          return -2;
        }
      }
    }
    iVar1 = mpt_library_symbol(&local_48,conf);
    if (iVar1 < 0) {
      if (out == (mpt_logger *)0x0) {
        iVar1 = mpt_library_detach(&local_48.lib);
        iVar6 = -2;
        if (iVar1 < 0) {
          abort();
        }
      }
      else {
        lVar3 = dlerror();
        if (lVar3 != 0) {
          msg(out,conf,3,(char *)CONCAT71(uVar5,uVar4),lVar3);
        }
        iVar1 = mpt_library_detach(&local_48.lib);
        iVar6 = -2;
        if ((iVar1 < 0) && (lVar3 = dlerror(), iVar6 = iVar1, lVar3 != 0)) {
          msg(out,conf,1,(char *)CONCAT71(uVar5,uVar4),lVar3);
        }
      }
    }
    else {
      mpt_library_detach(&sym->lib);
      sym->lib = local_48.lib;
      sym->addr = local_48.addr;
      sym->type = local_48.type;
    }
  }
  return iVar6;
}

Assistant:

extern int mpt_library_bind(MPT_STRUCT(libsymbol) *sym, const char *conf, const char *path, MPT_INTERFACE(logger) *out)
{
	MPT_STRUCT(libsymbol) next = MPT_LIBSYMBOL_INIT;
	const char *libname;
	int ret = 0;
	
	if (!conf) {
		if (out) {
			msg(out, __func__, MPT_LOG(Error), "%s", MPT_tr("missing initializer target"));
		}
		return MPT_ERROR(BadArgument);
	}
	if ((libname = strchr(conf, '@'))) {
		ret = 1;
		++libname;
		/* load from special or default location */
		if (!(next.lib = mpt_library_open(libname, path))) {
			const char *err;
			if (out && (err = dlerror())) {
				ret = path ? MPT_LOG(Error) : MPT_LOG(Warning);
				msg(out, __func__, ret, "%s", err);
			}
			if (!path) {
				return MPT_ERROR(BadValue);
			}
			/* fallback to default library locations */
			if (!(next.lib = mpt_library_open(libname, 0))) {
				if (out && (err = dlerror())) {
					msg(out, __func__, MPT_LOG(Error), "%s", err);
				}
				return MPT_ERROR(BadValue);
			}
			ret = 2;
		}
	}
	if (mpt_library_symbol(&next, conf) < 0) {
		const char *err;
		if (out && (err = dlerror())) {
			msg(out, __func__, MPT_LOG(Error), "%s", err);
		}
		if ((ret = mpt_library_detach(&next.lib)) < 0) {
			if (!out) {
				abort();
			}
			if ((err = dlerror())) {
				msg(out, __func__, MPT_LOG(Fatal), "%s", err);
			}
			return ret;
		}
		return MPT_ERROR(BadValue);
	}
	mpt_library_detach(&sym->lib);
	
	*sym = next;
	
	return ret;
}